

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O3

size_t TdokuEnumerate(char *puzzle,size_t limit,_func_void_char_ptr_void_ptr *callback,
                     void *callback_arg)

{
  undefined8 *puVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  Cells16 CVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  size_t *psVar11;
  ulong uVar12;
  SolverDpllTriadSimd<2> *pSVar13;
  size_t *psVar14;
  size_t *__dest;
  uint uVar15;
  long lVar16;
  State *state;
  long lVar17;
  long lVar18;
  uint uVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  Cells08 CVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  SolverDpllTriadSimd<2> local_520 [2];
  
  pSVar13 = local_520;
  lVar16 = 0;
  (anonymous_namespace)::solver_enum._488_8_ = 0;
  (anonymous_namespace)::solver_enum._496_8_ = 0;
  cVar2 = puzzle[0x51];
  do {
    lVar17 = 0x10;
    auVar27 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    *(undefined1 (*) [64])((long)local_520[0].solution_.bands[0][1].configurations.vec + lVar16) =
         auVar27;
    auVar27 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    *(undefined1 (*) [64])((long)local_520[0].solution_.bands[0][0].configurations.vec + lVar16) =
         auVar27;
    do {
      puVar1 = (undefined8 *)((long)((pSVar13->solution_).bands + -1) + 0x50 + lVar17);
      *puVar1 = 0x1ff01ff01ff01ff;
      puVar1[1] = 0x1ff01ff;
      puVar1 = (undefined8 *)((long)(pSVar13->solution_).bands[0][0].configurations.vec + lVar17);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar17 = lVar17 + 0x20;
    } while (lVar17 != 0x70);
    lVar16 = lVar16 + 0x60;
    pSVar13 = (SolverDpllTriadSimd<2> *)((pSVar13->solution_).bands + 1);
  } while (lVar16 != 0xc0);
  lVar16 = 0xc0;
  do {
    *(undefined8 *)((long)local_520[0].solution_.bands[0][0].configurations.vec + lVar16) =
         0x1ff01ff01ff01ff;
    *(undefined8 *)((long)local_520[0].solution_.bands[0][0].configurations.vec + lVar16 + 8) =
         0x1ff01ff01ff01ff;
    *(undefined8 *)((long)local_520[0].solution_.bands[0][0].eliminations.vec + lVar16) =
         0x1ff01ff01ff01ff;
    *(undefined8 *)((long)local_520[0].solution_.bands[0][0].eliminations.vec + lVar16 + 8U) =
         0x1ff01ff01ff01ff;
    lVar16 = lVar16 + 0x20;
  } while (lVar16 != 0x1e0);
  (anonymous_namespace)::solver_enum._480_8_ = limit;
  (anonymous_namespace)::solver_enum._504_8_ = callback;
  (anonymous_namespace)::solver_enum._512_8_ = callback_arg;
  if (cVar2 < '.') {
    auVar25[8] = 0x2e;
    auVar25._0_8_ = 0x2e2e2e2e2e2e2e2e;
    auVar25[9] = 0x2e;
    auVar25[10] = 0x2e;
    auVar25[0xb] = 0x2e;
    auVar25[0xc] = 0x2e;
    auVar25[0xd] = 0x2e;
    auVar25[0xe] = 0x2e;
    auVar25[0xf] = 0x2e;
    auVar25[0x10] = 0x2e;
    auVar25[0x11] = 0x2e;
    auVar25[0x12] = 0x2e;
    auVar25[0x13] = 0x2e;
    auVar25[0x14] = 0x2e;
    auVar25[0x15] = 0x2e;
    auVar25[0x16] = 0x2e;
    auVar25[0x17] = 0x2e;
    auVar25[0x18] = 0x2e;
    auVar25[0x19] = 0x2e;
    auVar25[0x1a] = 0x2e;
    auVar25[0x1b] = 0x2e;
    auVar25[0x1c] = 0x2e;
    auVar25[0x1d] = 0x2e;
    auVar25[0x1e] = 0x2e;
    auVar25[0x1f] = 0x2e;
    uVar7 = vpcmpeqb_avx512vl(auVar25,*(undefined1 (*) [32])(puzzle + 0x20));
    uVar6 = vpcmpeqb_avx512vl(auVar25,*(undefined1 (*) [32])puzzle);
    uVar12 = CONCAT44((int)uVar7,(int)uVar6);
    if (uVar12 != 0xffffffffffffffff) {
      uVar12 = ~uVar12;
      do {
        lVar16 = 0;
        for (uVar8 = uVar12; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
          lVar16 = lVar16 + 1;
        }
        bVar3 = (anonymous_namespace)::tables[lVar16 * 6 + 0x1901];
        CVar5.vec = (__m256i)vandnps_avx(*(undefined1 (*) [32])
                                          ((anonymous_namespace)::tables +
                                          (ulong)(byte)(anonymous_namespace)::tables
                                                       [lVar16 * 6 + 0x1905] * 0x20 +
                                          ((long)puzzle[lVar16] + -0x31) * 0x200),
                                         *&local_520[0].solution_.boxen
                                           [(byte)(anonymous_namespace)::tables[lVar16 * 6 + 0x1902]
                                           ].cells.vec);
        *&local_520[0].solution_.boxen[(byte)(anonymous_namespace)::tables[lVar16 * 6 + 0x1902]].
          cells.vec = CVar5.vec;
        auVar21 = vpbroadcastw_avx512vl();
        bVar4 = (anonymous_namespace)::tables[lVar16 * 6 + 0x1900];
        uVar12 = uVar12 - 1 & uVar12;
        CVar22.vec = (__m128i)vpternlogd_avx512vl(*(undefined1 (*) [16])
                                                   ((ulong)(byte)(anonymous_namespace)::tables
                                                                 [lVar16 * 6 + 0x1903] * 0x10 +
                                                   (ulong)bVar3 * 0x40 + 0x111160),auVar21,
                                                  *&local_520[0].solution_.bands[0][bVar4].
                                                    eliminations.vec,0xea);
        auVar23 = *(undefined1 (*) [16])
                   ((ulong)(byte)(anonymous_namespace)::tables[lVar16 * 6 + 0x1904] * 0x10 +
                   (ulong)bVar4 * 0x40 + 0x111160);
        *&local_520[0].solution_.bands[0][bVar4].eliminations.vec = CVar22.vec;
        auVar23 = vpternlogd_avx512vl(auVar23,auVar21,
                                      *(undefined1 (*) [16])
                                       (local_520[0].solution_.boxen[(ulong)bVar3 - 3].cells.vec + 2
                                       ),0xea);
        *(undefined1 (*) [16])(local_520[0].solution_.boxen[(ulong)bVar3 - 3].cells.vec + 2) =
             auVar23;
      } while (uVar12 != 0);
    }
    auVar23[8] = 0x2e;
    auVar23._0_8_ = 0x2e2e2e2e2e2e2e2e;
    auVar23[9] = 0x2e;
    auVar23[10] = 0x2e;
    auVar23[0xb] = 0x2e;
    auVar23[0xc] = 0x2e;
    auVar23[0xd] = 0x2e;
    auVar23[0xe] = 0x2e;
    auVar23[0xf] = 0x2e;
    uVar7 = vpcmpeqb_avx512vl(auVar23,*(undefined1 (*) [16])(puzzle + 0x40));
    if ((short)uVar7 != -1) {
      uVar10 = ~(uint)uVar7 & 0xffff;
      do {
        uVar15 = 0;
        for (uVar19 = uVar10; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x80000000) {
          uVar15 = uVar15 + 1;
        }
        lVar16 = (ulong)uVar15 + 0x40;
        bVar3 = (anonymous_namespace)::tables[lVar16 * 6 + 0x1901];
        CVar5.vec = (__m256i)vandnps_avx(*(undefined1 (*) [32])
                                          ((anonymous_namespace)::tables +
                                          (ulong)(byte)(anonymous_namespace)::tables
                                                       [lVar16 * 6 + 0x1905] * 0x20 +
                                          ((long)puzzle[(ulong)uVar15 + 0x40] + -0x31) * 0x200),
                                         *&local_520[0].solution_.boxen
                                           [(byte)(anonymous_namespace)::tables[lVar16 * 6 + 0x1902]
                                           ].cells.vec);
        *&local_520[0].solution_.boxen[(byte)(anonymous_namespace)::tables[lVar16 * 6 + 0x1902]].
          cells.vec = CVar5.vec;
        auVar21 = vpbroadcastw_avx512vl();
        bVar4 = (anonymous_namespace)::tables[lVar16 * 6 + 0x1900];
        uVar10 = uVar10 - 1 & uVar10;
        CVar22.vec = (__m128i)vpternlogd_avx512vl(*(undefined1 (*) [16])
                                                   ((ulong)(byte)(anonymous_namespace)::tables
                                                                 [lVar16 * 6 + 0x1903] * 0x10 +
                                                   (ulong)bVar3 * 0x40 + 0x111160),auVar21,
                                                  *&local_520[0].solution_.bands[0][bVar4].
                                                    eliminations.vec,0xea);
        auVar23 = *(undefined1 (*) [16])
                   ((ulong)(byte)(anonymous_namespace)::tables[lVar16 * 6 + 0x1904] * 0x10 +
                   (ulong)bVar4 * 0x40 + 0x111160);
        *&local_520[0].solution_.bands[0][bVar4].eliminations.vec = CVar22.vec;
        auVar23 = vpternlogd_avx512vl(auVar23,auVar21,
                                      *(undefined1 (*) [16])
                                       (local_520[0].solution_.boxen[(ulong)bVar3 - 3].cells.vec + 2
                                       ),0xea);
        *(undefined1 (*) [16])(local_520[0].solution_.boxen[(ulong)bVar3 - 3].cells.vec + 2) =
             auVar23;
      } while (uVar10 != 0);
    }
    if ((long)puzzle[0x50] != 0x2e) {
      auVar21 = vpbroadcastw_avx512vl();
      CVar5.vec = (__m256i)vpandn_avx2(*(undefined1 (*) [32])
                                        ((anonymous_namespace)::tables +
                                        (ulong)(anonymous_namespace)::tables[0x1ae5] * 0x20 +
                                        ((long)puzzle[0x50] + -0x31) * 0x200),
                                       *&local_520[0].solution_.boxen
                                         [(anonymous_namespace)::tables[0x1ae2]].cells.vec);
      *&local_520[0].solution_.boxen[(anonymous_namespace)::tables[0x1ae2]].cells.vec = CVar5.vec;
      CVar22.vec = (__m128i)vpternlogd_avx512vl(*(undefined1 (*) [16])
                                                 ((ulong)(anonymous_namespace)::tables[0x1ae3] *
                                                  0x10 + (ulong)(anonymous_namespace)::tables
                                                                [0x1ae1] * 0x40 + 0x111160),auVar21,
                                                *&local_520[0].solution_.bands[0]
                                                  [(anonymous_namespace)::tables[0x1ae0]].
                                                  eliminations.vec,0xea);
      auVar23 = *(undefined1 (*) [16])
                 ((ulong)(anonymous_namespace)::tables[0x1ae4] * 0x10 +
                 (ulong)(anonymous_namespace)::tables[0x1ae0] * 0x40 + 0x111160);
      *&local_520[0].solution_.bands[0][(anonymous_namespace)::tables[0x1ae0]].eliminations.vec =
           CVar22.vec;
      auVar23 = vpternlogd_avx512vl(auVar23,auVar21,
                                    *(undefined1 (*) [16])
                                     (local_520[0].solution_.boxen
                                      [(ulong)(anonymous_namespace)::tables[0x1ae1] - 3].cells.vec +
                                     2),0xea);
      *(undefined1 (*) [16])
       (local_520[0].solution_.boxen[(ulong)(anonymous_namespace)::tables[0x1ae1] - 3].cells.vec + 2
       ) = auVar23;
    }
    bVar20 = anon_unknown.dwarf_8b17::SolverDpllTriadSimd<2>::BandEliminate<0>
                       (&local_520[0].solution_,0,1);
    if (!bVar20) {
      return 0;
    }
    bVar20 = anon_unknown.dwarf_8b17::SolverDpllTriadSimd<2>::BandEliminate<1>
                       (&local_520[0].solution_,0,1);
    if (!bVar20) {
      return 0;
    }
    bVar20 = anon_unknown.dwarf_8b17::SolverDpllTriadSimd<2>::BandEliminate<0>
                       (&local_520[0].solution_,1,2);
    if ((!bVar20) ||
       (bVar20 = anon_unknown.dwarf_8b17::SolverDpllTriadSimd<2>::BandEliminate<1>
                           (&local_520[0].solution_,1,2), !bVar20)) {
      return 0;
    }
    bVar20 = anon_unknown.dwarf_8b17::SolverDpllTriadSimd<2>::BandEliminate<0>
                       (&local_520[0].solution_,2,0);
    if (!bVar20) {
      return 0;
    }
    state = (State *)0x2;
    bVar20 = anon_unknown.dwarf_8b17::SolverDpllTriadSimd<2>::BandEliminate<1>
                       (&local_520[0].solution_,2,0);
    if (!bVar20) {
      return 0;
    }
  }
  else {
    __dest = &local_520[0].limit_;
    memcpy(__dest,puzzle,0x2d9);
    auVar27 = ZEXT1664(CONCAT115(0x2e,CONCAT114(0x2e,CONCAT113(0x2e,CONCAT112(0x2e,CONCAT111(0x2e,
                                                  CONCAT110(0x2e,CONCAT19(0x2e,CONCAT18(0x2e,
                                                  0x2e2e2e2e2e2e2e2e)))))))));
    uVar12 = 0;
    bVar20 = false;
    do {
      lVar16 = 0;
      psVar14 = __dest;
      do {
        auVar26 = ZEXT3264(CONCAT230(0x1ff,CONCAT228(0x1ff,CONCAT226(0x1ff,CONCAT224(0x1ff,CONCAT222
                                                  (0x1ff,CONCAT220(0x1ff,CONCAT218(0x1ff,CONCAT216(
                                                  0x1ff,CONCAT214(0x1ff,CONCAT212(0x1ff,CONCAT210(
                                                  0x1ff,CONCAT28(0x1ff,0x1ff01ff01ff01ff))))))))))))
                          );
        uVar10 = 0;
        lVar17 = 0;
        psVar11 = psVar14;
        do {
          lVar18 = 0;
          uVar15 = uVar10;
          do {
            if (0xf < uVar15) goto LAB_0010503a;
            uVar7 = vpcmpb_avx512vl(auVar27._0_16_,*(undefined1 (*) [16])((long)psVar11 + lVar18),4)
            ;
            uVar19 = (uint)uVar7 & 0x1ff;
            auVar23 = auVar26._0_16_;
            auVar25 = auVar26._0_32_;
            switch(uVar15) {
            case 0:
              auVar23 = vpinsrw_avx(auVar23,uVar19,0);
              auVar24 = ZEXT1632(auVar23);
              break;
            case 1:
              auVar23 = vpinsrw_avx(auVar23,uVar19,1);
              auVar24 = ZEXT1632(auVar23);
              break;
            case 2:
              auVar23 = vpinsrw_avx(auVar23,uVar19,2);
              auVar24 = ZEXT1632(auVar23);
              break;
            case 3:
              auVar23 = vpinsrw_avx(auVar23,uVar19,3);
              auVar24 = ZEXT1632(auVar23);
              break;
            case 4:
              auVar23 = vpinsrw_avx(auVar23,uVar19,4);
              auVar24 = ZEXT1632(auVar23);
              break;
            case 5:
              auVar23 = vpinsrw_avx(auVar23,uVar19,5);
              auVar24 = ZEXT1632(auVar23);
              break;
            case 6:
              auVar23 = vpinsrw_avx(auVar23,uVar19,6);
              auVar24 = ZEXT1632(auVar23);
              break;
            case 7:
              auVar23 = vpinsrw_avx(auVar23,uVar19,7);
              auVar24 = ZEXT1632(auVar23);
              break;
            case 8:
              auVar24 = vpbroadcastw_avx512vl();
              auVar24 = vpblendw_avx2(auVar25,auVar24,1);
              goto LAB_00105034;
            case 9:
              auVar24 = vpbroadcastw_avx512vl();
              auVar24 = vpblendw_avx2(auVar25,auVar24,2);
              goto LAB_00105034;
            case 10:
              auVar24 = vpbroadcastw_avx512vl();
              auVar24 = vpblendw_avx2(auVar25,auVar24,4);
              goto LAB_00105034;
            case 0xb:
              auVar24 = vpbroadcastw_avx512vl();
              auVar24 = vpblendw_avx2(auVar25,auVar24,8);
              goto LAB_00105034;
            case 0xc:
              auVar24 = vpbroadcastw_avx512vl();
              auVar24 = vpblendw_avx2(auVar25,auVar24,0x10);
              goto LAB_00105034;
            case 0xd:
              auVar24 = vpbroadcastw_avx512vl();
              auVar24 = vpblendw_avx2(auVar25,auVar24,0x20);
              goto LAB_00105034;
            case 0xe:
              auVar24 = vpbroadcastw_avx512vl();
              auVar24 = vpblendw_avx2(auVar25,auVar24,0x40);
              goto LAB_00105034;
            case 0xf:
              auVar24 = vpbroadcastw_avx512vl();
              auVar24 = vpblendw_avx2(auVar25,auVar24,0x80);
LAB_00105034:
              auVar25 = vpblendd_avx2(auVar25,auVar24,0xf0);
              auVar26 = ZEXT3264(auVar25);
              goto LAB_0010503a;
            }
            auVar25 = vpblendd_avx2(auVar25,auVar24,0xf);
            auVar26 = ZEXT3264(auVar25);
LAB_0010503a:
            lVar18 = lVar18 + 9;
            uVar15 = uVar15 + 1;
          } while (lVar18 != 0x1b);
          lVar17 = lVar17 + 1;
          uVar10 = uVar10 + 4;
          psVar11 = (size_t *)((long)psVar11 + 0x51);
        } while (lVar17 != 3);
        uVar10 = (int)lVar16 + (int)uVar12 * 3;
        state = (State *)(ulong)uVar10;
        bVar9 = anon_unknown.dwarf_8b17::SolverDpllTriadSimd<2>::BoxRestrict<0>
                          (&local_520[0].solution_,uVar10,(Cells16 *)0x3);
        if (!bVar9) {
          if (!bVar20) {
            return 0;
          }
          goto LAB_00105452;
        }
        auVar27 = ZEXT1664(CONCAT115(0x2e,CONCAT114(0x2e,CONCAT113(0x2e,CONCAT112(0x2e,CONCAT111(
                                                  0x2e,CONCAT110(0x2e,CONCAT19(0x2e,CONCAT18(0x2e,
                                                  0x2e2e2e2e2e2e2e2e)))))))));
        lVar16 = lVar16 + 1;
        psVar14 = (size_t *)((long)psVar14 + 0x1b);
      } while (lVar16 != 3);
      bVar20 = 1 < uVar12;
      uVar12 = uVar12 + 1;
      __dest = (size_t *)((long)__dest + 0xf3);
    } while (uVar12 != 3);
  }
LAB_00105452:
  anon_unknown.dwarf_8b17::SolverDpllTriadSimd<2>::CountSolutionsConsistentWithPartialAssignment
            (local_520,state);
  return (anonymous_namespace)::solver_enum._488_8_;
}

Assistant:

size_t TdokuEnumerate(const char *puzzle, size_t limit,
                      void (*callback)(const char *, void *), void *callback_arg) {
    solver_enum.callback_ = callback;
    solver_enum.callback_arg_ = callback_arg;
    return solver_enum.SolveSudoku(puzzle, limit, nullptr, nullptr);
}